

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplekey.cpp
# Opt level: O3

void __thiscall YAML::Scanner::SimpleKey::Invalidate(SimpleKey *this)

{
  if (this->pIndent != (IndentMarker *)0x0) {
    this->pIndent->status = INVALID;
  }
  if (this->pMapStart != (Token *)0x0) {
    this->pMapStart->status = INVALID;
  }
  if (this->pKey != (Token *)0x0) {
    this->pKey->status = INVALID;
  }
  return;
}

Assistant:

void Scanner::SimpleKey::Invalidate() {
  if (pIndent)
    pIndent->status = IndentMarker::INVALID;
  if (pMapStart)
    pMapStart->status = Token::INVALID;
  if (pKey)
    pKey->status = Token::INVALID;
}